

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDsd.c
# Opt level: O2

Ivy_Obj_t * Ivy_ManDsdConstruct(Ivy_Man_t *p,Vec_Int_t *vFront,Vec_Int_t *vTree)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    if (vFront->nSize <= lVar3) {
      pIVar2 = Ivy_ManDsdConstruct_rec(p,vFront,vTree->nSize + -1,vTree);
      return pIVar2;
    }
    iVar1 = Vec_IntEntry(vFront,(int)lVar3);
    if (vFront->nSize <= lVar3) break;
    vFront->pArray[lVar3] = iVar1 >> 8;
    lVar3 = lVar3 + 1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

Ivy_Obj_t * Ivy_ManDsdConstruct( Ivy_Man_t * p, Vec_Int_t * vFront, Vec_Int_t * vTree )
{
    int Entry, i;
    // implement latches on the frontier (TEMPORARY!!!)
    Vec_IntForEachEntry( vFront, Entry, i )
        Vec_IntWriteEntry( vFront, i, Ivy_LeafId(Entry) );
    // recursively construct the tree
    return Ivy_ManDsdConstruct_rec( p, vFront, Vec_IntSize(vTree)-1, vTree );
}